

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::ConductorMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,ConductorMaterial *this)

{
  bool *unaff_RBX;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ ConductorMaterial displacement: %s eta: %s k: %s uRoughness: %s vRoughness: %s remapRoughness: %s]"
             ,(char *)this,(FloatTextureHandle *)&this->eta,&this->k,
             (SpectrumTextureHandle *)&this->uRoughness,&this->vRoughness,
             (FloatTextureHandle *)&this->remapRoughness,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string ConductorMaterial::ToString() const {
    return StringPrintf(
        "[ ConductorMaterial displacement: %s eta: %s k: %s uRoughness: %s "
        "vRoughness: %s remapRoughness: %s]",
        displacement, eta, k, uRoughness, vRoughness, remapRoughness);
}